

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e ktxTexture2_IterateLevels(ktxTexture2 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktxTexture2_private *pkVar1;
  byte bVar2;
  uint uVar3;
  ktx_error_code_e kVar4;
  uint uVar5;
  uint uVar6;
  ktx_uint32_t kVar7;
  
  kVar4 = KTX_INVALID_VALUE;
  if ((iterCb != (PFNKTXITERCB)0x0 && This != (ktxTexture2 *)0x0) &&
     (kVar4 = KTX_INVALID_OPERATION, This->supercompressionScheme == KTX_SS_BEGIN_RANGE)) {
    pkVar1 = This->_private;
    kVar7 = This->numLevels;
    do {
      kVar7 = kVar7 - 1;
      if ((int)kVar7 < 0) {
        return KTX_SUCCESS;
      }
      bVar2 = (byte)kVar7;
      uVar5 = This->baseWidth >> (bVar2 & 0x1f);
      uVar3 = This->baseHeight >> (bVar2 & 0x1f);
      uVar6 = This->baseDepth >> (bVar2 & 0x1f);
      kVar4 = (*iterCb)(kVar7,0,uVar5 + (uVar5 == 0),uVar3 + (uVar3 == 0),uVar6 + (uVar6 == 0),
                        pkVar1->_levelIndex[kVar7 & 0x7fffffff].uncompressedByteLength,
                        This->pData + This->_private->_levelIndex[kVar7 & 0x7fffffff].byteOffset,
                        userdata);
    } while (kVar4 == KTX_SUCCESS);
  }
  return kVar4;
}

Assistant:

KTX_error_code
ktxTexture2_IterateLevels(ktxTexture2* This, PFNKTXITERCB iterCb, void* userdata)
{
    KTX_error_code  result = KTX_SUCCESS;
    //ZSTD_DCtx* dctx;
    //ktx_uint8_t* decompBuf;
    ktxLevelIndexEntry* levelIndex = This->_private->_levelIndex;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; level--)
    {
        ktx_uint32_t width, height, depth;
        ktx_uint64_t levelSize;
        ktx_uint64_t offset;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> level);
        height = MAX(1, This->baseHeight >> level);
        depth = MAX(1, This->baseDepth  >> level);

        levelSize = levelIndex[level].uncompressedByteLength;
        offset = ktxTexture2_levelDataOffset(This, level);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        result = iterCb(level, 0, width, height, depth,
                        levelSize, This->pData + offset, userdata);
        if (result != KTX_SUCCESS)
            break;
    }

    return result;
}